

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O3

ObjectSplit * __thiscall
embree::avx::
HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
parallel_object_find
          (ObjectSplit *__return_storage_ptr__,
          HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>
          *this,PrimInfoExtRange *set,size_t logBlockSize,SplitInfo *info)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  undefined8 uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  char cVar12;
  unsigned_long __i0;
  long lVar13;
  ulong uVar14;
  runtime_error *this_00;
  int iVar15;
  long lVar16;
  size_t sVar17;
  ulong uVar18;
  size_t sVar19;
  int iVar20;
  uint *puVar21;
  undefined1 *puVar22;
  undefined1 (*pauVar23) [16];
  undefined4 *puVar24;
  undefined1 *puVar25;
  BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *__return_storage_ptr___00;
  blocked_range<unsigned_long> *range;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  undefined1 auVar30 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar31;
  undefined1 auVar32 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar33;
  undefined1 auVar34 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar35;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  BinMapping<32UL> mapping;
  task_group_context context;
  ObjectBinner binner;
  vfloat4 rAreas [32];
  task_group_context *in_stack_ffffffffffffe080;
  undefined1 local_1f20 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ee0;
  undefined1 local_1ed0 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ec0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1eb0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1ea0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e90;
  undefined1 local_1e80 [496];
  undefined1 auStack_1c90 [16];
  blocked_range<unsigned_long> local_1c80 [3];
  undefined4 local_1c30 [744];
  undefined1 auStack_1090 [16];
  uint local_1080 [2];
  undefined8 auStack_1078 [62];
  float afStack_e88 [2];
  undefined1 local_e80 [20];
  float afStack_e6c [763];
  undefined1 local_280 [592];
  
  lVar13 = 0xc00;
  puVar24 = local_1c30;
  do {
    puVar24[-4] = 0x7f800000;
    puVar24[-3] = 0x7f800000;
    puVar24[-2] = 0x7f800000;
    puVar24[-1] = 0x7f800000;
    *puVar24 = 0xff800000;
    puVar24[1] = 0xff800000;
    puVar24[2] = 0xff800000;
    puVar24[3] = 0xff800000;
    puVar24[-0xc] = 0x7f800000;
    puVar24[-0xb] = 0x7f800000;
    puVar24[-10] = 0x7f800000;
    puVar24[-9] = 0x7f800000;
    puVar24[-8] = 0xff800000;
    puVar24[-7] = 0xff800000;
    puVar24[-6] = 0xff800000;
    puVar24[-5] = 0xff800000;
    puVar24[-0x14] = 0x7f800000;
    puVar24[-0x13] = 0x7f800000;
    puVar24[-0x12] = 0x7f800000;
    puVar24[-0x11] = 0x7f800000;
    puVar24[-0x10] = 0xff800000;
    puVar24[-0xf] = 0xff800000;
    puVar24[-0xe] = 0xff800000;
    puVar24[-0xd] = 0xff800000;
    *(undefined8 *)((long)&local_1c80[0].my_end + lVar13) = 0;
    *(undefined8 *)((long)&local_1c80[0].my_begin + lVar13) = 0;
    lVar13 = lVar13 + 0x10;
    puVar24 = puVar24 + 0x18;
  } while (lVar13 != 0xe00);
  uVar5 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  uVar6 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  fVar26 = (float)(uVar6 - uVar5) * 0.05 + 4.0;
  uVar14 = (ulong)fVar26;
  puVar22 = (undefined1 *)((long)(fVar26 - 9.223372e+18) & (long)uVar14 >> 0x3f | uVar14);
  local_1ec0._0_8_ = &DAT_00000020;
  if (puVar22 < &DAT_00000020) {
    local_1ec0._0_8_ = puVar22;
  }
  local_1ed0._8_8_ = &local_1ec0;
  local_1eb0 = (set->super_CentGeomBBox3fa).centBounds.lower.field_0;
  auVar42 = vsubps_avx((undefined1  [16])(set->super_CentGeomBBox3fa).centBounds.upper.field_0,
                       (undefined1  [16])local_1eb0);
  auVar34._8_4_ = 0x704ec3d;
  auVar34._0_8_ = 0x704ec3d0704ec3d;
  auVar34._12_4_ = 0x704ec3d;
  auVar41 = vmaxps_avx(auVar34,auVar42);
  auVar42 = vcmpps_avx(auVar41,auVar34,6);
  auVar34 = vshufps_avx(ZEXT416((uint)((float)(long)local_1ec0._0_8_ * 0.99)),
                        ZEXT416((uint)((float)(long)local_1ec0._0_8_ * 0.99)),0);
  auVar41 = vdivps_avx(auVar34,auVar41);
  local_1ea0 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vandps_avx(auVar42,auVar41);
  local_1e80[0xc] = proxy_support;
  local_1e80[0xd] = (context_traits)0x4;
  local_1e80._32_16_ = ZEXT816(0) << 0x20;
  local_1e80._64_8_ = CUSTOM_CTX;
  local_1e90._0_8_ = this;
  local_1e90._8_8_ = local_1ed0._8_8_;
  tbb::detail::r1::initialize((task_group_context *)local_1e80);
  local_1ee0._8_8_ = uVar5;
  local_1ee0._0_8_ = uVar6;
  local_1ed0._0_8_ = 0x400;
  local_1f20._8_8_ = &local_1e90;
  local_1f20._0_8_ = (anon_class_16_2_ed117de8_conflict5 *)(local_1ed0 + 8);
  __return_storage_ptr___00 =
       (BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)local_e80;
  range = local_1c80;
  tbb::detail::d1::
  parallel_reduce<tbb::detail::d1::blocked_range<unsigned_long>,embree::avx::BinInfoT<32ul,embree::PrimRef,embree::BBox<embree::Vec3fa>>,embree::parallel_reduce<unsigned_long,embree::avx::BinInfoT<32ul,embree::PrimRef,embree::BBox<embree::Vec3fa>>,embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_object_find(embree::avx::PrimInfoExtRange_const&,unsigned_long,embree::avx::SplitInfoT<embree::BBox<embree::Vec3fa>>&)::_lambda(embree::range<unsigned_long>const&)_1_,embree::avx::HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,embree::PrimRef,32ul,16ul>::parallel_object_find(embree::avx::PrimInfoExtRange_const&,unsigned_long,embree::avx::SplitInfoT<embree::BBox<embree::Vec3fa>>&)::_lambda(embree::avx::BinInfoT<32ul,embree::PrimRef,embree::BBox<embree::Vec3fa>>const&,embree::avx::BinInfoT<32ul,embree::PrimRef,embree::BBox<embree::Vec3fa>>const&)_1_>(unsigned_long,unsigned_long,unsigned_long,embree::avx::BinInfoT<32ul,emb___::Vec3fa>>const__embree__avx__BinInfoT<32ul,embree::PrimRef,embree::BBox<embree::Vec3fa>>const___1_>
            (__return_storage_ptr___00,(d1 *)&local_1ee0.field_1,range,
             (BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)local_1f20,
             (anon_class_16_2_ed117de8_conflict5 *)(local_1ed0 + 8),
             (anon_class_8_1_a667e50d *)local_1e80,in_stack_ffffffffffffe080);
  cVar12 = tbb::detail::r1::is_group_execution_cancelled((task_group_context *)local_1e80);
  if (cVar12 == '\0') {
    tbb::detail::r1::destroy((task_group_context *)local_1e80);
    lVar13 = 0;
    do {
      lVar16 = 0x10;
      do {
        puVar1 = (undefined8 *)((long)(__return_storage_ptr___00->_bounds + -1) + 0x50 + lVar16);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)range + lVar16 + -0x10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        puVar2 = (undefined8 *)
                 ((long)&__return_storage_ptr___00->_bounds[0][0].lower.field_0 + lVar16);
        uVar4 = puVar2[1];
        puVar1 = (undefined8 *)((long)&range->my_end + lVar16);
        *puVar1 = *puVar2;
        puVar1[1] = uVar4;
        lVar16 = lVar16 + 0x20;
      } while (lVar16 != 0x70);
      lVar13 = lVar13 + 1;
      __return_storage_ptr___00 =
           (BinInfoT<32UL,_embree::PrimRef,_embree::BBox<embree::Vec3fa>_> *)
           (__return_storage_ptr___00->_bounds + 1);
      range = range + 4;
    } while (lVar13 != 0x20);
    memcpy(local_1080,local_280,0x200);
    puVar22 = (undefined1 *)(local_1ec0._0_8_ + -1);
    auVar41._8_4_ = 0x7f800000;
    auVar41._0_8_ = 0x7f8000007f800000;
    auVar41._12_4_ = 0x7f800000;
    auVar42._8_4_ = 0xff800000;
    auVar42._0_8_ = 0xff800000ff800000;
    auVar42._12_4_ = 0xff800000;
    if (puVar22 != (undefined1 *)0x0) {
      lVar13 = local_1ec0._0_8_ * 0x10;
      pauVar23 = (undefined1 (*) [16])(auStack_1c90 + local_1ec0._0_8_ * 0x60);
      auVar27 = ZEXT816(0) << 0x40;
      lVar16 = 0;
      puVar25 = puVar22;
      auVar32 = auVar41;
      auVar8 = auVar41;
      auVar37 = auVar42;
      auVar34 = auVar42;
      do {
        auVar27 = vpaddd_avx(auVar27,*(undefined1 (*) [16])(auStack_1090 + lVar16 + lVar13));
        auVar8 = vminps_avx(auVar8,pauVar23[-5]);
        auVar42 = vmaxps_avx(auVar42,pauVar23[-4]);
        *(undefined1 (*) [16])((long)&local_1e90 + lVar16 + lVar13) = auVar27;
        auVar11 = vsubps_avx(auVar42,auVar8);
        auVar41 = vminps_avx(auVar41,pauVar23[-3]);
        auVar34 = vmaxps_avx(auVar34,pauVar23[-2]);
        auVar38 = vsubps_avx(auVar34,auVar41);
        auVar7 = vinsertps_avx(auVar38,auVar11,0x4c);
        auVar10 = vshufpd_avx(auVar11,auVar11,1);
        auVar10 = vinsertps_avx(auVar10,auVar38,0x9c);
        auVar11 = vunpcklps_avx(auVar11,auVar38);
        auVar38._0_4_ =
             (auVar10._0_4_ + auVar7._0_4_) * auVar11._0_4_ + auVar10._0_4_ * auVar7._0_4_;
        auVar38._4_4_ =
             (auVar10._4_4_ + auVar7._4_4_) * auVar11._4_4_ + auVar10._4_4_ * auVar7._4_4_;
        auVar38._8_4_ =
             (auVar10._8_4_ + auVar7._8_4_) * auVar11._8_4_ + auVar10._8_4_ * auVar7._8_4_;
        auVar38._12_4_ =
             (auVar10._12_4_ + auVar7._12_4_) * auVar11._12_4_ + auVar10._12_4_ * auVar7._12_4_;
        uVar4 = vmovlps_avx(auVar38);
        *(undefined8 *)((long)afStack_e88 + lVar16 + lVar13 + -8) = uVar4;
        auVar32 = vminps_avx(auVar32,pauVar23[-1]);
        auVar37 = vmaxps_avx(auVar37,*pauVar23);
        auVar11 = vsubps_avx(auVar37,auVar32);
        auVar7 = vmovshdup_avx(auVar11);
        auVar10 = vshufpd_avx(auVar11,auVar11,1);
        *(float *)((long)afStack_e88 + lVar16 + lVar13) =
             (auVar7._0_4_ + auVar10._0_4_) * auVar11._0_4_ + auVar7._0_4_ * auVar10._0_4_;
        *(undefined4 *)((long)afStack_e88 + lVar16 + lVar13 + 4) = 0;
        lVar16 = lVar16 + -0x10;
        pauVar23 = pauVar23 + -6;
        puVar25 = puVar25 + -1;
      } while (puVar25 != (undefined1 *)0x0);
    }
    uVar14 = 0xffffffff;
    if ((ulong)local_1ec0._0_8_ < (undefined1 *)0x2) {
      local_1ee0.m128[2] = INFINITY;
      local_1ee0._0_8_ = 0x7f8000007f800000;
      local_1ee0.m128[3] = INFINITY;
      local_1f20._0_16_ = ZEXT816(0) << 0x40;
    }
    else {
      auVar8 = vpshufd_avx(ZEXT416((uint)~(-1 << ((byte)logBlockSize & 0x1f))),0);
      auVar30 = ZEXT1664((undefined1  [16])0x0);
      auVar32._8_8_ = 0x100000001;
      auVar32._0_8_ = 0x100000001;
      aVar35.m128[2] = INFINITY;
      aVar35._0_8_ = 0x7f8000007f800000;
      aVar35.m128[3] = INFINITY;
      auVar37._8_4_ = 0xff800000;
      auVar37._0_8_ = 0xff800000ff800000;
      auVar37._12_4_ = 0xff800000;
      auVar34 = ZEXT816(0) << 0x40;
      pauVar23 = (undefined1 (*) [16])local_1c30;
      lVar13 = 0;
      auVar42 = auVar37;
      auVar41 = auVar37;
      aVar31 = aVar35;
      local_1ee0 = aVar35;
      aVar33 = aVar35;
      do {
        aVar33.m128 = (__m128)vminps_avx(aVar33.m128,pauVar23[-5]);
        auVar37 = vmaxps_avx(auVar37,pauVar23[-4]);
        aVar35.m128 = (__m128)vminps_avx(aVar35.m128,pauVar23[-3]);
        auVar42 = vmaxps_avx(auVar42,pauVar23[-2]);
        auVar10 = vsubps_avx(auVar37,(undefined1  [16])aVar33);
        auVar38 = vsubps_avx(auVar42,(undefined1  [16])aVar35);
        aVar31.m128 = (__m128)vminps_avx(aVar31.m128,pauVar23[-1]);
        auVar41 = vmaxps_avx(auVar41,*pauVar23);
        auVar40 = vsubps_avx(auVar41,(undefined1  [16])aVar31);
        auVar27 = vshufps_avx(auVar10,auVar40,0x65);
        auVar27 = vblendps_avx(auVar27,auVar38,2);
        auVar7 = vshufps_avx(auVar10,auVar40,0x96);
        auVar11 = vinsertps_avx(auVar7,auVar38,0x90);
        auVar7 = vshufps_avx(auVar10,auVar40,0);
        auVar34 = vpaddd_avx(auVar34,*(undefined1 (*) [16])((long)local_1080 + lVar13));
        auVar38 = vinsertps_avx(auVar7,auVar38,0x10);
        auVar7 = vpaddd_avx(auVar34,auVar8);
        auVar7 = vpsrld_avx(auVar7,ZEXT416((uint)logBlockSize));
        auVar10 = vpaddd_avx(auVar8,*(undefined1 (*) [16])(local_1e80 + lVar13 + 0x10));
        auVar40 = vpsrad_avx(auVar7,0x1f);
        auVar9._8_8_ = 0x4f0000004f000000;
        auVar9._0_8_ = 0x4f0000004f000000;
        auVar40 = vpand_avx(auVar40,auVar9);
        auVar28._8_4_ = 0x7fffffff;
        auVar28._0_8_ = 0x7fffffff7fffffff;
        auVar28._12_4_ = 0x7fffffff;
        auVar7 = vpand_avx(auVar7,auVar28);
        auVar7 = vcvtdq2ps_avx(auVar7);
        auVar10 = vpsrld_avx(auVar10,ZEXT416((uint)logBlockSize));
        auVar39 = vpsrad_avx(auVar10,0x1f);
        auVar9 = vpand_avx(auVar9,auVar39);
        auVar10 = vpand_avx(auVar10,auVar28);
        auVar10 = vcvtdq2ps_avx(auVar10);
        auVar39._0_4_ =
             (auVar38._0_4_ * (auVar27._0_4_ + auVar11._0_4_) + auVar27._0_4_ * auVar11._0_4_) *
             (auVar40._0_4_ + auVar7._0_4_) +
             (auVar10._0_4_ + auVar9._0_4_) * *(float *)(local_e80 + lVar13 + 0x10);
        auVar39._4_4_ =
             (auVar38._4_4_ * (auVar27._4_4_ + auVar11._4_4_) + auVar27._4_4_ * auVar11._4_4_) *
             (auVar40._4_4_ + auVar7._4_4_) +
             (auVar10._4_4_ + auVar9._4_4_) * *(float *)((long)afStack_e6c + lVar13);
        auVar39._8_4_ =
             (auVar38._8_4_ * (auVar27._8_4_ + auVar11._8_4_) + auVar27._8_4_ * auVar11._8_4_) *
             (auVar40._8_4_ + auVar7._8_4_) +
             (auVar10._8_4_ + auVar9._8_4_) * *(float *)((long)afStack_e6c + lVar13 + 4);
        auVar39._12_4_ =
             (auVar38._12_4_ * (auVar27._12_4_ + auVar11._12_4_) + auVar27._12_4_ * auVar11._12_4_)
             * (auVar40._12_4_ + auVar7._12_4_) +
             (auVar10._12_4_ + auVar9._12_4_) * *(float *)((long)afStack_e6c + lVar13 + 8);
        auVar27 = vcmpps_avx(auVar39,(undefined1  [16])local_1ee0,1);
        local_1f20._0_16_ = vblendvps_avx(auVar30._0_16_,auVar32,auVar27);
        auVar30 = ZEXT1664(local_1f20._0_16_);
        local_1ee0.m128 = (__m128)vminps_avx(auVar39,local_1ee0.m128);
        auVar32 = vpsubd_avx(auVar32,_DAT_01f7ae20);
        pauVar23 = pauVar23 + 6;
        lVar13 = lVar13 + 0x10;
        puVar22 = puVar22 + -1;
      } while (puVar22 != (undefined1 *)0x0);
    }
    fVar26 = INFINITY;
    uVar18 = 0;
    iVar15 = 0;
    do {
      fVar3 = *(float *)((long)&local_1ea0 + uVar18 * 4);
      if ((((fVar3 != 0.0) || (NAN(fVar3))) &&
          (fVar3 = *(float *)((long)&local_1ee0 + uVar18 * 4), fVar3 < fVar26)) &&
         (*(int *)(local_1f20 + uVar18 * 4) != 0)) {
        uVar14 = uVar18 & 0xffffffff;
        iVar15 = *(int *)(local_1f20 + uVar18 * 4);
        fVar26 = fVar3;
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != 3);
    __return_storage_ptr__->sah = fVar26;
    iVar20 = (int)uVar14;
    __return_storage_ptr__->dim = iVar20;
    (__return_storage_ptr__->field_2).pos = iVar15;
    __return_storage_ptr__->data = 0;
    (__return_storage_ptr__->mapping).num = local_1ec0._0_8_;
    *(undefined8 *)&(__return_storage_ptr__->mapping).ofs.field_0 = local_1eb0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) = local_1eb0._8_8_;
    *(undefined8 *)&(__return_storage_ptr__->mapping).scale.field_0 = local_1ea0._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) = local_1ea0._8_8_;
    if (iVar20 == -1) {
      info->leftCount = SUB168(ZEXT816(0) << 0x20,0);
      info->rightCount = SUB168(ZEXT816(0) << 0x20,8);
      aVar29.m128[2] = INFINITY;
      aVar29._0_8_ = 0x7f8000007f800000;
      aVar29.m128[3] = INFINITY;
      (info->leftBounds).lower.field_0 = aVar29;
      aVar33.m128[2] = -INFINITY;
      aVar33._0_8_ = 0xff800000ff800000;
      aVar33.m128[3] = -INFINITY;
      aVar31 = aVar33;
    }
    else {
      puVar22 = (undefined1 *)(long)iVar15;
      aVar31.m128[2] = -INFINITY;
      aVar31._0_8_ = 0xff800000ff800000;
      aVar31.m128[3] = -INFINITY;
      aVar29.m128[2] = INFINITY;
      aVar29._0_8_ = 0x7f8000007f800000;
      aVar29.m128[3] = INFINITY;
      lVar13 = (long)iVar20;
      if (iVar15 == 0) {
        sVar17 = 0;
        aVar36 = aVar29;
        aVar33 = aVar31;
      }
      else {
        puVar21 = local_1080 + lVar13;
        pauVar23 = (undefined1 (*) [16])((long)local_1c80 + lVar13 * 0x20 + 0x10);
        aVar36.m128[2] = INFINITY;
        aVar36._0_8_ = 0x7f8000007f800000;
        aVar36.m128[3] = INFINITY;
        aVar33.m128[2] = -INFINITY;
        aVar33._0_8_ = 0xff800000ff800000;
        aVar33.m128[3] = -INFINITY;
        sVar17 = 0;
        puVar25 = puVar22;
        do {
          aVar36.m128 = (__m128)vminps_avx(aVar36.m128,pauVar23[-1]);
          aVar33.m128 = (__m128)vmaxps_avx(aVar33.m128,*pauVar23);
          sVar17 = sVar17 + *puVar21;
          puVar21 = puVar21 + 4;
          pauVar23 = pauVar23 + 6;
          puVar25 = puVar25 + -1;
        } while (puVar25 != (undefined1 *)0x0);
      }
      lVar16 = local_1ec0._0_8_ - (long)puVar22;
      if ((ulong)local_1ec0._0_8_ < puVar22 || lVar16 == 0) {
        sVar19 = 0;
      }
      else {
        puVar21 = local_1080 + lVar13 + (long)puVar22 * 4;
        pauVar23 = (undefined1 (*) [16])
                   ((long)local_1c80 + lVar13 * 0x20 + (long)puVar22 * 0x60 + 0x10);
        aVar29.m128[2] = INFINITY;
        aVar29._0_8_ = 0x7f8000007f800000;
        aVar29.m128[3] = INFINITY;
        aVar31.m128[2] = -INFINITY;
        aVar31._0_8_ = 0xff800000ff800000;
        aVar31.m128[3] = -INFINITY;
        sVar19 = 0;
        do {
          aVar29.m128 = (__m128)vminps_avx(aVar29.m128,pauVar23[-1]);
          aVar31.m128 = (__m128)vmaxps_avx(aVar31.m128,*pauVar23);
          sVar19 = sVar19 + *puVar21;
          puVar21 = puVar21 + 4;
          pauVar23 = pauVar23 + 6;
          lVar16 = lVar16 + -1;
        } while (lVar16 != 0);
      }
      info->leftCount = sVar17;
      info->rightCount = sVar19;
      (info->leftBounds).lower.field_0 = aVar36;
    }
    (info->leftBounds).upper.field_0 = aVar33;
    (info->rightBounds).lower.field_0 = aVar29;
    (info->rightBounds).upper.field_0 = aVar31;
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"task cancelled");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

parallel_object_find(const PrimInfoExtRange& set, const size_t logBlockSize, SplitInfo &info)
        {
          ObjectBinner binner(empty);
          const BinMapping<OBJECT_BINS> mapping(set);
          const BinMapping<OBJECT_BINS>& _mapping = mapping; // CLANG 3.4 parser bug workaround
          binner = parallel_reduce(set.begin(),set.end(),PARALLEL_FIND_BLOCK_SIZE,binner,
                                   [&] (const range<size_t>& r) -> ObjectBinner { ObjectBinner binner(empty); binner.bin(prims0+r.begin(),r.size(),_mapping); return binner; },
                                   [&] (const ObjectBinner& b0, const ObjectBinner& b1) -> ObjectBinner { ObjectBinner r = b0; r.merge(b1,_mapping.size()); return r; });
          ObjectSplit s = binner.best(mapping,logBlockSize);
          binner.getSplitInfo(mapping, s, info);
          return s;
        }